

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::record_shader_module
          (StateRecorder *this,VkShaderModule module,VkShaderModuleCreateInfo *create_info,
          Hash custom_hash)

{
  bool bVar1;
  int iVar2;
  mutex *__mutex;
  VkShaderModuleCreateInfo *new_info;
  VkShaderModuleCreateInfo *local_58;
  WorkItem local_50;
  
  __mutex = &this->impl->record_lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    local_58 = (VkShaderModuleCreateInfo *)0x0;
    bVar1 = Impl::copy_shader_module
                      (this->impl,create_info,&this->impl->temp_allocator,false,&local_58);
    if (bVar1) {
      local_50.type = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
      local_50.create_info = local_58;
      local_50.handle = (uint64_t)module;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
    }
    else {
      Impl::push_unregister_locked<VkShaderModule_T*>
                (this->impl,VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,module);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (bVar1) {
      Impl::pump_synchronized_recording(this->impl,this);
    }
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool StateRecorder::record_shader_module(VkShaderModule module, const VkShaderModuleCreateInfo &create_info,
                                         Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkShaderModuleCreateInfo *new_info = nullptr;
		if (!impl->copy_shader_module(&create_info, impl->temp_allocator, false, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, module);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, api_object_cast<uint64_t>(module),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}